

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

void do_cmd(char *host,char *user,char *cmd)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  Conf *pCVar4;
  char *pcVar5;
  BackendVtable *pBVar6;
  size_t sVar7;
  char *pcVar8;
  LogContext *logctx_00;
  char *key;
  char *atsign;
  char *q;
  char *p;
  char *host_1;
  char *hostbuf;
  Conf *conf2;
  LogContext *logctx;
  char *realhost;
  char *err;
  char *cmd_local;
  char *user_local;
  char *host_local;
  
  err = cmd;
  cmd_local = user;
  user_local = host;
  if ((host == (char *)0x0) || (*host == '\0')) {
    bump("Empty host name");
  }
  sVar3 = host_strcspn(host,":");
  host[sVar3] = '\0';
  _Var1 = cmdline_loaded_session();
  if (_Var1) {
    conf_set_str(conf,0,user_local);
  }
  else {
    pCVar4 = conf_new();
    conf_set_str(pCVar4,0,anon_var_dwarf_23ee3 + 10);
    do_defaults(user_local,pCVar4);
    pcVar5 = conf_get_str(pCVar4,0);
    if (*pcVar5 == '\0') {
      conf_set_str(conf,0,user_local);
    }
    else {
      do_defaults(user_local,conf);
    }
    conf_free(pCVar4);
  }
  iVar2 = conf_get_int(conf,2);
  pBVar6 = backend_vt_from_proto(iVar2);
  if (pBVar6 == (BackendVtable *)0x0) {
    conf_set_int(conf,2,3);
    conf_set_int(conf,1,0x16);
  }
  cmdline_run_saved(conf);
  pcVar5 = conf_get_str(conf,0);
  pcVar5 = dupstr(pcVar5);
  sVar7 = strspn(pcVar5," \t");
  p = pcVar5 + sVar7;
  if ((*p != '\0') && (pcVar8 = strrchr(p,0x40), pcVar8 != (char *)0x0)) {
    *pcVar8 = '\0';
    conf_set_str(conf,0x39,p);
    p = pcVar8 + 1;
  }
  q = pcVar5;
  for (atsign = p; *atsign != '\0'; atsign = atsign + 1) {
    if ((*atsign != ' ') && (*atsign != '\t')) {
      *q = *atsign;
      q = q + 1;
    }
  }
  *q = '\0';
  conf_set_str(conf,0,pcVar5);
  safefree(pcVar5);
  if ((cmd_local == (char *)0x0) || (*cmd_local == '\0')) {
    pcVar5 = conf_get_str(conf,0x39);
    if (*pcVar5 == '\0') {
      cmd_local = get_username();
      if (cmd_local == (char *)0x0) {
        bump("Empty user name");
      }
      if ((verbose & 1U) != 0) {
        tell_user(_stderr,"Guessing user name: %s",cmd_local);
      }
      conf_set_str(conf,0x39,cmd_local);
      safefree(cmd_local);
    }
  }
  else {
    conf_set_str(conf,0x39,cmd_local);
  }
  iVar2 = conf_get_int(conf,2);
  pBVar6 = backend_vt_from_proto(iVar2);
  if (pBVar6 == (BackendVtable *)0x0) {
    conf_set_int(conf,2,3);
    conf_set_int(conf,1,0x16);
  }
  conf_set_bool(conf,0xaa,false);
  conf_set_bool(conf,0x1e,false);
  conf_set_bool(conf,0xbf,true);
  while (pcVar5 = conf_get_str_nthstrkey(conf,0xb0,0), pcVar5 != (char *)0x0) {
    conf_del_str_str(conf,0xb0,pcVar5);
  }
  conf_set_str(conf,0x15,anon_var_dwarf_23ee3 + 10);
  if ((try_sftp & 1U) == 0) {
    main_cmd_is_sftp = false;
    conf_set_str(conf,0x14,err);
    conf_set_bool(conf,0x30,false);
  }
  else {
    main_cmd_is_sftp = true;
    conf_set_str(conf,0x14,"sftp");
    conf_set_bool(conf,0x30,true);
    if ((try_scp & 1U) == 0) {
      fallback_cmd_is_sftp = true;
      conf_set_str(conf,0x15,
                   "test -x /usr/lib/sftp-server && exec /usr/lib/sftp-server\ntest -x /usr/local/lib/sftp-server && exec /usr/local/lib/sftp-server\nexec sftp-server"
                  );
      conf_set_bool(conf,0x31,false);
    }
    else {
      fallback_cmd_is_sftp = false;
      conf_set_str(conf,0x15,err);
      conf_set_bool(conf,0x31,false);
    }
  }
  conf_set_bool(conf,0x16,true);
  logctx_00 = log_init(console_cli_logpolicy,conf);
  platform_psftp_pre_conn_setup(console_cli_logpolicy);
  iVar2 = conf_get_int(conf,2);
  pBVar6 = backend_vt_from_proto(iVar2);
  pCVar4 = conf;
  pcVar5 = conf_get_str(conf,0);
  iVar2 = conf_get_int(conf,1);
  _Var1 = conf_get_bool(conf,8);
  realhost = backend_init(pBVar6,pscp_seat,&backend,logctx_00,pCVar4,pcVar5,iVar2,(char **)&logctx,
                          false,_Var1);
  if (realhost == (char *)0x0) {
    ssh_scp_init();
    if ((((verbose & 1U) != 0) && (logctx != (LogContext *)0x0)) && (errs == 0)) {
      tell_user(_stderr,"Connected to %s",logctx);
    }
    safefree(logctx);
    return;
  }
  bump("ssh_init: %s",realhost);
}

Assistant:

static void do_cmd(char *host, char *user, char *cmd)
{
    const char *err;
    char *realhost;
    LogContext *logctx;

    if (host == NULL || host[0] == '\0')
        bump("Empty host name");

    /*
     * Remove a colon suffix.
     */
    host[host_strcspn(host, ":")] = '\0';

    /*
     * If we haven't loaded session details already (e.g., from -load),
     * try looking for a session called "host".
     */
    if (!cmdline_loaded_session()) {
        /* Try to load settings for `host' into a temporary config */
        Conf *conf2 = conf_new();
        conf_set_str(conf2, CONF_host, "");
        do_defaults(host, conf2);
        if (conf_get_str(conf2, CONF_host)[0] != '\0') {
            /* Settings present and include hostname */
            /* Re-load data into the real config. */
            do_defaults(host, conf);
        } else {
            /* Session doesn't exist or mention a hostname. */
            /* Use `host' as a bare hostname. */
            conf_set_str(conf, CONF_host, host);
        }
        conf_free(conf2);
    } else {
        /* Patch in hostname `host' to session details. */
        conf_set_str(conf, CONF_host, host);
    }

    /*
     * Force protocol to SSH if the user has somehow contrived to
     * select one we don't support (e.g. by loading an inappropriate
     * saved session). In that situation we assume the port number is
     * useless too.)
     */
    if (!backend_vt_from_proto(conf_get_int(conf, CONF_protocol))) {
        conf_set_int(conf, CONF_protocol, PROT_SSH);
        conf_set_int(conf, CONF_port, 22);
    }

    /*
     * Enact command-line overrides.
     */
    cmdline_run_saved(conf);

    /*
     * Muck about with the hostname in various ways.
     */
    {
        char *hostbuf = dupstr(conf_get_str(conf, CONF_host));
        char *host = hostbuf;
        char *p, *q;

        /*
         * Trim leading whitespace.
         */
        host += strspn(host, " \t");

        /*
         * See if host is of the form user@host, and separate out
         * the username if so.
         */
        if (host[0] != '\0') {
            char *atsign = strrchr(host, '@');
            if (atsign) {
                *atsign = '\0';
                conf_set_str(conf, CONF_username, host);
                host = atsign + 1;
            }
        }

        /*
         * Remove any remaining whitespace.
         */
        p = hostbuf;
        q = host;
        while (*q) {
            if (*q != ' ' && *q != '\t')
                *p++ = *q;
            q++;
        }
        *p = '\0';

        conf_set_str(conf, CONF_host, hostbuf);
        sfree(hostbuf);
    }

    /* Set username */
    if (user != NULL && user[0] != '\0') {
        conf_set_str(conf, CONF_username, user);
    } else if (conf_get_str(conf, CONF_username)[0] == '\0') {
        user = get_username();
        if (!user)
            bump("Empty user name");
        else {
            if (verbose)
                tell_user(stderr, "Guessing user name: %s", user);
            conf_set_str(conf, CONF_username, user);
            sfree(user);
        }
    }

    /*
     * Force protocol to SSH if the user has somehow contrived to
     * select one we don't support (e.g. by loading an inappropriate
     * saved session). In that situation we assume the port number is
     * useless too.)
     */
    if (!backend_vt_from_proto(conf_get_int(conf, CONF_protocol))) {
        conf_set_int(conf, CONF_protocol, PROT_SSH);
        conf_set_int(conf, CONF_port, 22);
    }

    /*
     * Disable scary things which shouldn't be enabled for simple
     * things like SCP and SFTP: agent forwarding, port forwarding,
     * X forwarding.
     */
    conf_set_bool(conf, CONF_x11_forward, false);
    conf_set_bool(conf, CONF_agentfwd, false);
    conf_set_bool(conf, CONF_ssh_simple, true);
    {
        char *key;
        while ((key = conf_get_str_nthstrkey(conf, CONF_portfwd, 0)) != NULL)
            conf_del_str_str(conf, CONF_portfwd, key);
    }

    /*
     * Set up main and possibly fallback command depending on
     * options specified by user.
     * Attempt to start the SFTP subsystem as a first choice,
     * falling back to the provided scp command if that fails.
     */
    conf_set_str(conf, CONF_remote_cmd2, "");
    if (try_sftp) {
        /* First choice is SFTP subsystem. */
        main_cmd_is_sftp = true;
        conf_set_str(conf, CONF_remote_cmd, "sftp");
        conf_set_bool(conf, CONF_ssh_subsys, true);
        if (try_scp) {
            /* Fallback is to use the provided scp command. */
            fallback_cmd_is_sftp = false;
            conf_set_str(conf, CONF_remote_cmd2, cmd);
            conf_set_bool(conf, CONF_ssh_subsys2, false);
        } else {
            /* Since we're not going to try SCP, we may as well try
             * harder to find an SFTP server, since in the current
             * implementation we have a spare slot. */
            fallback_cmd_is_sftp = true;
            /* see psftp.c for full explanation of this kludge */
            conf_set_str(conf, CONF_remote_cmd2,
                         "test -x /usr/lib/sftp-server &&"
                         " exec /usr/lib/sftp-server\n"
                         "test -x /usr/local/lib/sftp-server &&"
                         " exec /usr/local/lib/sftp-server\n"
                         "exec sftp-server");
            conf_set_bool(conf, CONF_ssh_subsys2, false);
        }
    } else {
        /* Don't try SFTP at all; just try the scp command. */
        main_cmd_is_sftp = false;
        conf_set_str(conf, CONF_remote_cmd, cmd);
        conf_set_bool(conf, CONF_ssh_subsys, false);
    }
    conf_set_bool(conf, CONF_nopty, true);

    logctx = log_init(console_cli_logpolicy, conf);

    platform_psftp_pre_conn_setup(console_cli_logpolicy);

    err = backend_init(backend_vt_from_proto(
                           conf_get_int(conf, CONF_protocol)),
                       pscp_seat, &backend, logctx, conf,
                       conf_get_str(conf, CONF_host),
                       conf_get_int(conf, CONF_port),
                       &realhost, 0,
                       conf_get_bool(conf, CONF_tcp_keepalives));
    if (err != NULL)
        bump("ssh_init: %s", err);
    ssh_scp_init();
    if (verbose && realhost != NULL && errs == 0)
        tell_user(stderr, "Connected to %s", realhost);
    sfree(realhost);
}